

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

void VLin1VectorArray_Serial(int nvec,sunrealtype a,N_Vector *X,N_Vector *Y,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  sunrealtype *zd;
  sunrealtype *yd;
  sunrealtype *xd;
  sunindextype N;
  sunindextype j;
  int i;
  N_Vector *Z_local;
  N_Vector *Y_local;
  N_Vector *X_local;
  sunrealtype a_local;
  int nvec_local;
  
  lVar1 = *(*X)->content;
  for (i = 0; i < nvec; i = i + 1) {
    lVar2 = *(long *)((long)X[i]->content + 0x10);
    lVar3 = *(long *)((long)Y[i]->content + 0x10);
    lVar4 = *(long *)((long)Z[i]->content + 0x10);
    for (j = 0; j < lVar1; j = j + 1) {
      *(double *)(lVar4 + j * 8) = a * *(double *)(lVar2 + j * 8) + *(double *)(lVar3 + j * 8);
    }
  }
  return;
}

Assistant:

static void VLin1VectorArray_Serial(int nvec, sunrealtype a, N_Vector* X,
                                    N_Vector* Y, N_Vector* Z)
{
  int i;
  sunindextype j, N;
  sunrealtype* xd = NULL;
  sunrealtype* yd = NULL;
  sunrealtype* zd = NULL;

  N = NV_LENGTH_S(X[0]);

  for (i = 0; i < nvec; i++)
  {
    xd = NV_DATA_S(X[i]);
    yd = NV_DATA_S(Y[i]);
    zd = NV_DATA_S(Z[i]);
    for (j = 0; j < N; j++) { zd[j] = (a * xd[j]) + yd[j]; }
  }
}